

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O3

_Bool fiber_alloc(Fiber *fbr,size_t size,FiberCleanupFunc cleanup,void *arg,FiberFlags flags)

{
  _Bool _Var1;
  ulong uVar2;
  void *pvVar3;
  short sVar4;
  ulong uVar5;
  long lVar6;
  ushort uVar7;
  undefined8 *local_38;
  
  fbr->stack_size = size;
  uVar7 = flags & 0x18;
  if (uVar7 == 0) {
    pvVar3 = malloc(size);
    fbr->stack = pvVar3;
    fbr->alloc_stack = pvVar3;
    if (pvVar3 == (void *)0x0) {
      return false;
    }
  }
  else {
    if (get_page_size_PAGE_SIZE == 0) {
      get_page_size_PAGE_SIZE = sysconf(0x1e);
    }
    uVar5 = get_page_size_PAGE_SIZE;
    uVar2 = (size + get_page_size_PAGE_SIZE) - 1;
    lVar6 = (ulong)((flags & 8) >> 3) + uVar2 / get_page_size_PAGE_SIZE;
    pvVar3 = (void *)memalign(get_page_size_PAGE_SIZE,
                              ((lVar6 + 1) - (ulong)(uVar7 < 0x10)) * get_page_size_PAGE_SIZE,
                              uVar2 % get_page_size_PAGE_SIZE);
    fbr->alloc_stack = pvVar3;
    if (pvVar3 == (void *)0x0) {
      return false;
    }
    sVar4 = (short)(flags & 8);
    if (((sVar4 != 0) && (_Var1 = protect_page(pvVar3,false), !_Var1)) ||
       ((0xf < uVar7 &&
        (_Var1 = protect_page((void *)(lVar6 * uVar5 + (long)fbr->alloc_stack),false), !_Var1)))) {
      free(fbr->alloc_stack);
      return false;
    }
    if (sVar4 == 0) {
      uVar5 = 0;
    }
    pvVar3 = (void *)(uVar5 + (long)fbr->alloc_stack);
    fbr->stack = pvVar3;
  }
  fbr->state = uVar7;
  (fbr->regs).lr = (void *)0x0;
  (fbr->regs).rbp = (void *)0x0;
  (fbr->regs).rbx = (void *)0x0;
  (fbr->regs).r12 = (void *)0x0;
  (fbr->regs).r13 = (void *)0x0;
  (fbr->regs).r14 = (void *)0x0;
  (fbr->regs).r15 = (void *)0x0;
  (fbr->regs).sp = (void *)((long)pvVar3 + (fbr->stack_size - 8) & 0xfffffffffffffff0);
  fiber_reserve_return(fbr,fiber_guard,&local_38,0x18);
  *local_38 = fbr;
  local_38[1] = cleanup;
  local_38[2] = arg;
  *(byte *)&fbr->state = (byte)fbr->state | 4;
  return true;
}

Assistant:

bool
fiber_alloc(Fiber *fbr,
            size_t size,
            FiberCleanupFunc cleanup,
            void *arg,
            FiberFlags flags)
{
    NULL_CHECK(fbr, "Fiber cannot be NULL");
    flags &= FIBER_FLAG_GUARD_LO | FIBER_FLAG_GUARD_HI;
    fbr->stack_size = size;
    const size_t stack_size = size;

    if (!flags) {
        fbr->alloc_stack = fbr->stack = malloc(stack_size);
        if (!fbr->alloc_stack)
            return false;
    } else {
        size_t pgsz = get_page_size();
        size_t npages = (size + pgsz - 1) / pgsz;
        if (flags & FIBER_FLAG_GUARD_LO)
            ++npages;
        if (flags & FIBER_FLAG_GUARD_HI)
            ++npages;
        fbr->alloc_stack = alloc_aligned_chunks(npages, pgsz);
        if (hu_unlikely(!fbr->alloc_stack))
            return false;

        if (flags & FIBER_FLAG_GUARD_LO)
            if (hu_unlikely(!protect_page(fbr->alloc_stack, false)))
                goto fail;

        if (flags & FIBER_FLAG_GUARD_HI)
            if (hu_unlikely(!protect_page(
                  (char *) fbr->alloc_stack + (npages - 1) * pgsz, false)))
                goto fail;
        if (flags & FIBER_FLAG_GUARD_LO)
            fbr->stack = (char *) fbr->alloc_stack + pgsz;
        else
            fbr->stack = fbr->alloc_stack;
    }

    fbr->state = flags;
    fiber_init_(fbr, cleanup, arg);
    return true;

fail:
    free_pages(fbr->alloc_stack);
    return false;
}